

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_identifier_expr(gvisitor_t *self,gnode_identifier_expr_t *node)

{
  ushort uVar1;
  gnode_location_type gVar2;
  long *plVar3;
  gravity_function_t *f;
  ircode_t *code;
  char *s;
  gupvalue_t *pgVar4;
  gravity_vm *pgVar5;
  uint32_t p1;
  uint32_t uVar6;
  uint32_t uVar7;
  uint16_t uVar8;
  opcode_t op;
  char cVar9;
  uint32_t uVar10;
  gravity_value_t gVar11;
  
  plVar3 = (long *)self->data;
  f = *(gravity_function_t **)(plVar3[2] + -8 + *plVar3 * 8);
  if ((f == (gravity_function_t *)0x0) || (f->isa != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  gVar2 = (node->location).type;
  if (LOCATION_CLASS_IVAR_OUTER < gVar2) {
    return;
  }
  code = *(ircode_t **)((long)&f->field_9 + 0x50);
  cVar9 = (node->base).is_assignment;
  s = node->value;
  uVar1 = (node->location).index;
  uVar7 = (uint32_t)uVar1;
  switch(gVar2) {
  case LOCATION_LOCAL:
    if ((_Bool)cVar9 == false) {
      ircode_register_push(code,uVar7);
      return;
    }
    p1 = ircode_register_pop(code);
    if (p1 == 0xffffffff) {
      report_error(self,&node->base,"Invalid identifier expression.");
    }
    if (node == (gnode_identifier_expr_t *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (node->base).token.lineno;
    }
    op = MOVE;
    break;
  case LOCATION_GLOBAL:
    pgVar5 = (gravity_vm *)plVar3[7];
    uVar10 = 0;
    gVar11 = gravity_string_to_value((gravity_vm *)0x0,s,0xffffffff);
    uVar8 = gravity_function_cpool_add(pgVar5,f,gVar11);
    if ((_Bool)cVar9 == false) {
      uVar7 = ircode_register_push_temp(code);
      p1 = (uint32_t)uVar8;
      if (node != (gnode_identifier_expr_t *)0x0) {
        uVar10 = (node->base).token.lineno;
      }
      op = LOADG;
      uVar6 = 0;
      goto LAB_0013bfdd;
    }
    uVar7 = ircode_register_pop(code);
    if (uVar7 == 0xffffffff) {
      report_error(self,&node->base,"Invalid identifier expression.");
    }
    p1 = (uint32_t)uVar8;
    if (node == (gnode_identifier_expr_t *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (node->base).token.lineno;
    }
    op = STOREG;
    break;
  case LOCATION_UPVALUE:
    pgVar4 = node->upvalue;
    if ((_Bool)cVar9 == false) {
      uVar7 = ircode_register_push_temp(code);
      p1 = pgVar4->selfindex;
      if (node == (gnode_identifier_expr_t *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (node->base).token.lineno;
      }
      op = LOADU;
    }
    else {
      uVar7 = ircode_register_pop(code);
      if (uVar7 == 0xffffffff) {
        report_error(self,&node->base,"Invalid identifier expression.");
      }
      p1 = pgVar4->selfindex;
      if (node == (gnode_identifier_expr_t *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (node->base).token.lineno;
      }
      op = STOREU;
    }
    break;
  default:
    p1 = 0;
    if (gVar2 == LOCATION_CLASS_IVAR_OUTER) {
      uVar8 = (node->location).nup;
      p1 = ircode_register_push_temp(code);
      if (uVar8 == 0) {
        p1 = 0;
      }
      else {
        uVar6 = 0;
        do {
          uVar10 = 0;
          if (node != (gnode_identifier_expr_t *)0x0) {
            uVar10 = (node->base).token.lineno;
          }
          ircode_add(code,LOAD,p1,uVar6,0x100,uVar10);
          uVar8 = uVar8 - 1;
          uVar6 = p1;
        } while (uVar8 != 0);
      }
      if (((_Bool)cVar9 != false) && (uVar6 = ircode_register_pop(code), uVar6 == 0xffffffff)) {
        visit_identifier_expr_cold_2();
      }
    }
    if (uVar1 == 0xffff) {
      pgVar5 = *(gravity_vm **)((long)self->data + 0x38);
      gVar11 = gravity_string_to_value((gravity_vm *)0x0,s,0xffffffff);
      uVar8 = gravity_function_cpool_add(pgVar5,f,gVar11);
      uVar6 = ircode_register_push_temp(code);
      uVar7 = 0;
      if (node != (gnode_identifier_expr_t *)0x0) {
        uVar7 = (node->base).token.lineno;
      }
      ircode_add(code,LOADK,uVar6,(uint)uVar8,0,uVar7);
      uVar7 = ircode_register_pop(code);
      if (uVar7 == 0xffffffff) {
        visit_identifier_expr_cold_1();
      }
    }
    else {
      uVar6 = uVar7 + 0x100;
    }
    if (cVar9 == '\0') {
      uVar7 = p1;
      if (gVar2 != LOCATION_CLASS_IVAR_OUTER) {
        uVar7 = ircode_register_push_temp(code);
      }
      if (node == (gnode_identifier_expr_t *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (node->base).token.lineno;
      }
      op = LOAD;
    }
    else {
      uVar7 = ircode_register_pop(code);
      if (uVar7 == 0xffffffff) {
        report_error(self,&node->base,"Invalid identifier expression.");
      }
      if (node == (gnode_identifier_expr_t *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (node->base).token.lineno;
      }
      op = STORE;
    }
    goto LAB_0013bfdd;
  }
  uVar6 = 0;
LAB_0013bfdd:
  ircode_add(code,op,uVar7,p1,uVar6,uVar10);
  return;
}

Assistant:

static void visit_identifier_expr (gvisitor_t *self, gnode_identifier_expr_t *node) {
    DEBUG_CODEGEN("visit_identifier_expr %s", node->value);
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // check if the node is a left expression of an assignment
    bool is_assignment = node->base.is_assignment;

    const char            *identifier = node->value;        // identifier as c string
    gnode_location_type    type = node->location.type;        // location type
    uint16_t            index = node->location.index;    // symbol index
    uint16_t            nup = node->location.nup;        // upvalue index or outer index

    switch (type) {

        // local variable
        case LOCATION_LOCAL: {
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, MOVE, index, reg, 0, LINE_NUMBER(node));
            } else {
                ircode_register_push(code, index);
            }
        } break;

        // module (global) variable
        case LOCATION_GLOBAL: {
            uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STOREG, reg, kindex, 0, LINE_NUMBER(node));
            } else {
				ircode_add(code, LOADG, ircode_register_push_temp(code), kindex, 0, LINE_NUMBER(node));
            }
        } break;

        // upvalue access
        case LOCATION_UPVALUE: {
            gupvalue_t *upvalue = node->upvalue;
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STOREU, reg, upvalue->selfindex, 0, LINE_NUMBER(node));
            } else {
				ircode_add(code, LOADU, ircode_register_push_temp(code), upvalue->selfindex, 0, LINE_NUMBER(node));
            }
        } break;

        // class ivar case (outer case just need a loop lookup before)
        case LOCATION_CLASS_IVAR_OUTER:
        case LOCATION_CLASS_IVAR_SAME: {
            // needs to differentiate ivar (indexed by an integer) from other cases (indexed by a string)
            bool        is_ivar = (index != UINT16_MAX);
            uint32_t    dest = 0;
            uint32_t    target = 0;

            if (type == LOCATION_CLASS_IVAR_OUTER) {
                dest = ircode_register_push_temp(code);
                for (uint16_t i=0; i<nup; ++i) {
					ircode_add(code, LOAD, dest, target, 0 + MAX_REGISTERS, LINE_NUMBER(node));
                    target = dest;
                }
                if (is_assignment) {
                    uint32_t temp = ircode_register_pop(code);
                    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
                }
            }

            uint32_t index_register;
            if (is_ivar) {
                // ivar case, use an index to load/retrieve it
                index_register = index + MAX_REGISTERS;
            } else {
                // not an ivar so it could be another class declaration like a func, a class or an enum
                // use lookup in order to retrieve it (assignment is handled here so you can change a
                // first class citizen at runtime too)
                uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
                index_register = ircode_register_push_temp(code);
				ircode_add(code, LOADK, index_register, kindex, 0, LINE_NUMBER(node));
                uint32_t temp = ircode_register_pop(code);
                DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
            }

            if (is_assignment) {
                // should be prohibited by semantic to store something into a non ivar slot?
                dest = ircode_register_pop(code); // consume temp register
                if (dest == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STORE, dest, target, index_register, LINE_NUMBER(node));
            } else {
                dest = (type == LOCATION_CLASS_IVAR_OUTER) ? target : ircode_register_push_temp(code);
				ircode_add(code, LOAD, dest , target, index_register, LINE_NUMBER(node));
            }
        } break;
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);
}